

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src)

{
  cmTargetInternals *pcVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  size_type sVar3;
  cmSourceFile *pcVar4;
  cmListFileBacktrace lfbt;
  cmSourceFileLocation sfl;
  cmListFileBacktrace cStack_88;
  cmSourceFileLocation local_68;
  
  cmSourceFileLocation::cmSourceFileLocation(&local_68,this->Makefile,src);
  pcVar1 = (this->Internal).Pointer;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<TargetPropertyEntryFinder>>
                    ((pcVar1->SourceEntries).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pcVar1->SourceEntries).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
  if (_Var2._M_current ==
      (((this->Internal).Pointer)->SourceEntries).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmMakefile::GetBacktrace(&cStack_88,this->Makefile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&((this->Internal).Pointer)->SourceEntries,src);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
              (&((this->Internal).Pointer)->SourceBacktraces,&cStack_88);
    cmListFileBacktrace::~cmListFileBacktrace(&cStack_88);
  }
  sVar3 = cmGeneratorExpression::Find(src);
  if (sVar3 == 0xffffffffffffffff) {
    pcVar4 = cmMakefile::GetOrCreateSource(this->Makefile,src,false);
  }
  else {
    pcVar4 = (cmSourceFile *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.Name._M_dataplus._M_p != &local_68.Name.field_2) {
    operator_delete(local_68.Name._M_dataplus._M_p,local_68.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.Directory._M_dataplus._M_p != &local_68.Directory.field_2) {
    operator_delete(local_68.Directory._M_dataplus._M_p,
                    local_68.Directory.field_2._M_allocated_capacity + 1);
  }
  return pcVar4;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src)
{
  cmSourceFileLocation sfl(this->Makefile, src);
  if (std::find_if(this->Internal->SourceEntries.begin(),
                   this->Internal->SourceEntries.end(),
                   TargetPropertyEntryFinder(sfl)) ==
      this->Internal->SourceEntries.end()) {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(src);
    this->Internal->SourceBacktraces.push_back(lfbt);
  }
  if (cmGeneratorExpression::Find(src) != std::string::npos) {
    return CM_NULLPTR;
  }
  return this->Makefile->GetOrCreateSource(src);
}